

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor_rational.hpp
# Opt level: O3

void __thiscall soplex::CLUFactorRational::remaxCol(CLUFactorRational *this,int p_col,int len)

{
  Col *pCVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  long lVar5;
  Dring *pDVar6;
  int *piVar7;
  Dring *pDVar8;
  int iVar9;
  int iVar10;
  int n;
  int iVar11;
  Dring *pDVar12;
  uint uVar13;
  ulong uVar14;
  
  pCVar1 = &(this->u).col;
  pDVar8 = (this->u).col.elem;
  pDVar6 = pDVar8[p_col].next;
  if ((Col *)pDVar6 == pCVar1) {
    piVar7 = (this->u).col.max;
    iVar9 = len - piVar7[p_col];
    iVar11 = (this->u).col.used;
    if (iVar9 <= (this->u).col.size - iVar11) goto LAB_0018be8c;
    pDVar8 = (this->u).col.list.next;
    if ((Col *)pDVar8 == pCVar1) {
      uVar13 = 0;
    }
    else {
      piVar2 = (this->u).col.idx;
      piVar3 = (this->u).col.len;
      piVar4 = (this->u).col.start;
      uVar14 = 0;
      do {
        iVar11 = pDVar8->idx;
        if (piVar4[iVar11] != (int)uVar14) goto LAB_0018bce3;
        iVar9 = piVar3[iVar11];
        uVar13 = (int)uVar14 + iVar9;
        uVar14 = (ulong)uVar13;
        piVar7[iVar11] = iVar9;
        pDVar8 = pDVar8->next;
      } while ((Col *)pDVar8 != pCVar1);
    }
    goto LAB_0018be22;
  }
  iVar11 = (this->u).col.used;
  if (len <= (this->u).col.size - iVar11) goto LAB_0018bd93;
  pDVar12 = (this->u).col.list.next;
  piVar7 = (this->u).col.max;
  if ((Col *)pDVar12 == pCVar1) {
    uVar13 = 0;
  }
  else {
    piVar2 = (this->u).col.idx;
    piVar3 = (this->u).col.len;
    piVar4 = (this->u).col.start;
    uVar14 = 0;
    do {
      iVar11 = pDVar12->idx;
      if (piVar4[iVar11] != (int)uVar14) goto LAB_0018bc35;
      iVar9 = piVar3[iVar11];
      uVar13 = (int)uVar14 + iVar9;
      uVar14 = (ulong)uVar13;
      piVar7[iVar11] = iVar9;
      pDVar12 = pDVar12->next;
    } while ((Col *)pDVar12 != pCVar1);
  }
  goto LAB_0018bd27;
LAB_0018bce3:
  do {
    iVar11 = pDVar8->idx;
    iVar9 = piVar4[iVar11];
    lVar5 = (long)iVar9;
    piVar4[iVar11] = (int)uVar14;
    iVar10 = piVar3[iVar11];
    piVar7[iVar11] = iVar10;
    if (0 < iVar10) {
      uVar14 = (ulong)(int)uVar14;
      do {
        piVar2[uVar14] = piVar2[lVar5];
        uVar14 = uVar14 + 1;
        lVar5 = lVar5 + 1;
      } while (lVar5 < iVar10 + iVar9);
    }
    uVar13 = (uint)uVar14;
    pDVar8 = pDVar8->next;
  } while ((Col *)pDVar8 != pCVar1);
LAB_0018be22:
  (this->u).col.used = uVar13;
  piVar7[this->thedim] = 0;
  iVar10 = (this->u).col.size;
  iVar11 = (this->u).col.used;
  iVar9 = len - piVar7[p_col];
  if (((double)iVar10 < (double)len + (double)iVar11 * this->colMemMult) &&
     (n = len + iVar11 * 2, iVar10 < n)) {
    (this->u).col.size = n;
    spx_realloc<int*>(&(this->u).col.idx,n);
    iVar11 = (this->u).col.used;
    piVar7 = (this->u).col.max;
  }
LAB_0018be8c:
  (this->u).col.used = iVar11 + iVar9;
  piVar7[p_col] = len;
  return;
LAB_0018bc35:
  do {
    iVar11 = pDVar12->idx;
    iVar9 = piVar4[iVar11];
    lVar5 = (long)iVar9;
    piVar4[iVar11] = (int)uVar14;
    iVar10 = piVar3[iVar11];
    piVar7[iVar11] = iVar10;
    if (0 < iVar10) {
      uVar14 = (ulong)(int)uVar14;
      do {
        piVar2[uVar14] = piVar2[lVar5];
        uVar14 = uVar14 + 1;
        lVar5 = lVar5 + 1;
      } while (lVar5 < iVar10 + iVar9);
    }
    uVar13 = (uint)uVar14;
    pDVar12 = pDVar12->next;
  } while ((Col *)pDVar12 != pCVar1);
LAB_0018bd27:
  (this->u).col.used = uVar13;
  piVar7[this->thedim] = 0;
  iVar9 = (this->u).col.size;
  iVar11 = (this->u).col.used;
  if (((double)iVar9 < (double)len + (double)iVar11 * this->colMemMult) &&
     (iVar10 = len + iVar11 * 2, iVar9 < iVar10)) {
    (this->u).col.size = iVar10;
    spx_realloc<int*>(&(this->u).col.idx,iVar10);
    iVar11 = (this->u).col.used;
    pDVar8 = (this->u).col.elem;
    pDVar6 = pDVar8[p_col].next;
  }
LAB_0018bd93:
  piVar7 = (this->u).col.start;
  iVar9 = piVar7[p_col];
  lVar5 = (long)iVar9;
  iVar10 = (this->u).col.len[p_col];
  piVar7[p_col] = iVar11;
  piVar7 = &(this->u).col.used;
  *piVar7 = *piVar7 + len;
  piVar7 = (this->u).col.max;
  pDVar8 = pDVar8 + p_col;
  pDVar12 = pDVar8->prev;
  piVar7[pDVar12->idx] = piVar7[pDVar12->idx] + piVar7[p_col];
  piVar7[p_col] = len;
  pDVar6->prev = pDVar12;
  pDVar12->next = pDVar6;
  pDVar6 = (this->u).col.list.prev;
  pDVar12 = pDVar6->next;
  pDVar8->next = pDVar12;
  pDVar12->prev = pDVar8;
  pDVar8->prev = pDVar6;
  pDVar6->next = pDVar8;
  if (0 < iVar10) {
    piVar2 = (this->u).col.idx;
    piVar7 = piVar2 + iVar11;
    do {
      *piVar7 = piVar2[lVar5];
      lVar5 = lVar5 + 1;
      piVar7 = piVar7 + 1;
    } while (lVar5 < iVar10 + iVar9);
  }
  return;
}

Assistant:

inline void CLUFactorRational::remaxCol(int p_col, int len)
{
   assert(u.col.max[p_col] < len);

   if(u.col.elem[p_col].next == &(u.col.list))      /* last in column file */
   {
      int delta = len - u.col.max[p_col];

      if(delta > u.col.size - u.col.used)
      {
         packColumns();
         delta = len - u.col.max[p_col];

         if(u.col.size < colMemMult * u.col.used + len)
            minColMem(2 * u.col.used + len);

         /* minColMem(colMemMult * u.col.used + len); */
      }

      assert(delta <= u.col.size - u.col.used

             && "ERROR: could not allocate memory for column file");

      u.col.used += delta;
      u.col.max[p_col] = len;
   }

   else                        /* column must be moved to end of column file */
   {
      int i, j, k;
      int* idx;
      Dring* ring;

      if(len > u.col.size - u.col.used)
      {
         packColumns();

         if(u.col.size < colMemMult * u.col.used + len)
            minColMem(2 * u.col.used + len);

         /* minColMem(colMemMult * u.col.used + len); */
      }

      assert(len <= u.col.size - u.col.used

             && "ERROR: could not allocate memory for column file");

      j = u.col.used;
      i = u.col.start[p_col];
      k = u.col.len[p_col] + i;
      u.col.start[p_col] = j;
      u.col.used += len;

      u.col.max[u.col.elem[p_col].prev->idx] += u.col.max[p_col];
      u.col.max[p_col] = len;
      removeDR(u.col.elem[p_col]);
      ring = u.col.list.prev;
      init2DR(u.col.elem[p_col], *ring);

      idx = u.col.idx;

      for(; i < k; ++i)
         idx[j++] = idx[i];
   }
}